

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mcu8str_create(mcu8str *__return_storage_ptr__,mcu8str_size_t prealloc_size)

{
  int iVar1;
  char *pcVar2;
  mcu8str *extraout_RAX;
  mcu8str *pmVar3;
  undefined8 *puVar4;
  mcu8str *str;
  uint uVar5;
  
  if (prealloc_size == 0) {
    __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
    __return_storage_ptr__->size = 0;
    uVar5 = 0;
    iVar1 = 0;
  }
  else {
    puVar4 = (undefined8 *)prealloc_size;
    if (prealloc_size >> 1 < 0x7fffffff) {
      str = (mcu8str *)(prealloc_size + 1);
      pcVar2 = (char *)malloc((size_t)str);
    }
    else {
      pcVar2 = (char *)0x0;
      str = __return_storage_ptr__;
    }
    __return_storage_ptr__->c_str = pcVar2;
    if (pcVar2 == (char *)0x0) {
      mcu8str_create_cold_1();
      pmVar3 = extraout_RAX;
      if (*(int *)(puVar4 + 1) != 0) {
        uVar5 = *(int *)(puVar4 + 1) + str->size;
        if (str->buflen <= uVar5) {
          mcu8str_reserve(str,(ulong)uVar5);
        }
        memcpy(str->c_str + str->size,(void *)*puVar4,(ulong)*(uint *)(puVar4 + 1));
        pmVar3 = (mcu8str *)str->c_str;
        *(undefined1 *)((long)&pmVar3->c_str + (ulong)uVar5) = 0;
        str->size = uVar5;
      }
      return pmVar3;
    }
    *pcVar2 = '\0';
    __return_storage_ptr__->size = 0;
    uVar5 = (int)prealloc_size + 1;
    iVar1 = 1;
  }
  __return_storage_ptr__->buflen = uVar5;
  __return_storage_ptr__->owns_memory = iVar1;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mcu8str_create( mcu8str_size_t prealloc_size )
  {
    MCTOOLS_STATIC_ASSERT( sizeof(int)==sizeof(unsigned) );
    MCTOOLS_STATIC_ASSERT( sizeof(size_t)>=sizeof(unsigned) );
    MCTOOLS_STATIC_ASSERT( sizeof(unsigned)>=4 );
    MCTOOLS_STATIC_ASSERT( sizeof(size_t)>=4 );
    MCTOOLS_STATIC_ASSERT( sizeof(void*)>=4 );

    if ( prealloc_size == 0 )
      return mcu8str_create_empty();
    mcu8str s;
    //Limit prealloc_size, since we use unsigned type to store the size in
    //buflen below:
    s.c_str = (char*) ( MCTOOLS_STROKFORUINT(prealloc_size)
                        ? STDNS malloc( prealloc_size+1 ) : NULL);
    if ( !s.c_str ) {
#ifdef MCFILEUTILS_CPPNAMESPACE
      throw std::bad_alloc();
#else
      fprintf(stderr, "ERROR: Memory allocation failed in mcu8str_create\n");
      exit(EXIT_FAILURE);
#endif
      //gives (correctly but annoyingly) unreachable warning with MSVC
      //return mcu8str_create_empty();
    }
    s.c_str[0] = '\0';
    s.size = 0;
    s.buflen = (unsigned)(prealloc_size + 1);//cast ok, checked above
    s.owns_memory = 1;
    return s;
  }